

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  const_iterator this_00;
  reference pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  iterator *__return_storage_ptr___00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90 [3];
  const_iterator local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  const_iterator iter;
  iterator piter;
  size_type rootPathLen;
  path *this_local;
  
  sVar3 = root_name_length(this);
  bVar1 = has_root_directory(this);
  uVar4 = std::__cxx11::string::length();
  if (sVar3 + (long)(int)(uint)bVar1 < uVar4) {
    bVar1 = empty(this);
    if (bVar1) {
      path(__return_storage_ptr__);
    }
    else {
      __return_storage_ptr___00 = (iterator *)&iter;
      end(__return_storage_ptr___00,this);
      local_78._M_current = (char *)std::__cxx11::string::end();
      this_00 = iterator::decrement(__return_storage_ptr___00,&local_78);
      local_70._M_current = this_00._M_current;
      std::__cxx11::string::begin();
      local_90[0] = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(this_00._M_current,(difference_type)__return_storage_ptr___00);
      bVar2 = __gnu_cxx::operator>(&local_70,local_90);
      bVar1 = false;
      if (bVar2) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_70);
        bVar1 = *pcVar5 != '/';
      }
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(&local_70);
      }
      first._M_current = (char *)std::__cxx11::string::begin();
      path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (__return_storage_ptr__,first,local_70,native_format);
      iterator::~iterator((iterator *)&iter);
    }
  }
  else {
    path(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    if (rootPathLen < _path.length()) {
        if (empty()) {
            return path();
        }
        else {
            auto piter = end();
            auto iter = piter.decrement(_path.end());
            if (iter > _path.begin() + static_cast<long>(rootPathLen) && *iter != preferred_separator) {
                --iter;
            }
            return path(_path.begin(), iter, native_format);
        }
    }
    else {
        return *this;
    }
}